

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getString(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
              _func_void_char_ptr_char_ptr *check)

{
  char *__s;
  string *psVar1;
  invalid_argument *this;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  SetAttr local_58;
  
  if (*i <= argc + -2) {
    __s = argv[(long)*i + 1];
    if (check != (_func_void_char_ptr_char_ptr *)0x0) {
      (*check)(attrName,__s);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_78,attrName,&local_99);
    psVar1 = (string *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>(local_98,__s,&local_9a);
    Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute(psVar1);
    std::__cxx11::string::string((string *)&local_58,local_78);
    local_58.part = part;
    local_58.attr = (Attribute *)psVar1;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    *i = *i + 2;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a string");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getString (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const char str[]) = 0)
{
    if (i > argc - 2) throw invalid_argument ("Expected a string");

    const char* str = argv[i + 1];

    if (check) check (attrName, str);

    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 2;
}